

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::add_pp_def(CTcMake *this,char *sym,char *expan,int is_def)

{
  CTcMakeDef *nxt;
  undefined4 in_ECX;
  textchar_t *in_RDX;
  CTcMakeDef *in_RSI;
  long in_RDI;
  CTcMakeDef *def;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  nxt = (CTcMakeDef *)operator_new(0x20);
  CTcMakeDef::CTcMakeDef
            (in_RSI,in_RDX,(textchar_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (*(long *)(in_RDI + 0x78) == 0) {
    *(CTcMakeDef **)(in_RDI + 0x70) = nxt;
  }
  else {
    CTcMakeDef::set_next(*(CTcMakeDef **)(in_RDI + 0x78),nxt);
  }
  *(CTcMakeDef **)(in_RDI + 0x78) = nxt;
  return;
}

Assistant:

void CTcMake::add_pp_def(const char *sym, const char *expan, int is_def)
{
    CTcMakeDef *def;

    /* create the new list entry */
    def = new CTcMakeDef(sym, expan, is_def);

    /* link it in at the end of our list */
    if (def_tail_ != 0)
        def_tail_->set_next(def);
    else
        def_head_ = def;
    def_tail_ = def;
}